

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

real_t __thiscall
xLearn::AUCMetric::CalcAUC
          (AUCMetric *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *positive_vec,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *negative_vec)

{
  uint uVar1;
  size_type sVar2;
  size_type sVar3;
  ostream *poVar4;
  ostream *poVar5;
  reference pvVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  string *in_RSI;
  long in_RDI;
  undefined1 auVar7 [16];
  undefined1 in_ZMM1 [64];
  index_t i;
  double auc_res;
  double auc;
  longlong positivesum_dot_negativesum;
  longlong pre_positive_sum;
  longlong negative_sum;
  longlong positive_sum;
  allocator *function;
  int line;
  string *file;
  LogSeverity severity;
  uint local_b4;
  double local_a8;
  long local_90;
  long local_88;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  Logger local_1c [7];
  
  file = in_RSI;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RSI);
  line = (int)((ulong)in_RSI >> 0x20);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  if (sVar2 != sVar3) {
    Logger::Logger(local_1c,ERR);
    severity = (LogSeverity)((ulong)in_RDI >> 0x20);
    function = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h"
               ,function);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"CalcAUC",&local_79);
    poVar4 = Logger::Start(severity,file,line,(string *)function);
    poVar4 = std::operator<<(poVar4,"CHECK_EQ failed ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x23b);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"positive_vec.size()");
    poVar4 = std::operator<<(poVar4," = ");
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)file);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar2);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"negative_vec.size()");
    poVar4 = std::operator<<(poVar4," = ");
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
    poVar5 = (ostream *)std::ostream::operator<<(poVar4,sVar2);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    Logger::~Logger((Logger *)poVar4);
    abort();
  }
  local_88 = 0;
  local_90 = 0;
  local_a8 = 0.0;
  for (local_b4 = 0; auVar7 = in_ZMM1._0_16_, local_b4 < 1000000; local_b4 = local_b4 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x18),
                        (ulong)local_b4);
    uVar1 = *pvVar6;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x30),
                        (ulong)local_b4);
    local_90 = (ulong)*pvVar6 + local_90;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x30),
                        (ulong)local_b4);
    auVar7 = vcvtusi2sd_avx512f(auVar7,*pvVar6);
    in_ZMM1 = ZEXT1664(ZEXT816(0x4000000000000000));
    local_a8 = ((double)(long)(local_88 + (ulong)uVar1 + local_88) * auVar7._0_8_ * 1.0) / 2.0 +
               local_a8;
    local_88 = (ulong)uVar1 + local_88;
  }
  return (float)(1.0 - local_a8 / (double)(local_88 * local_90));
}

Assistant:

real_t CalcAUC(std::vector<index_t> positive_vec,
                 std::vector<index_t> negative_vec) {
    CHECK_EQ(positive_vec.size(), negative_vec.size());
    long long positive_sum = 0;
    long long negative_sum= 0;
    long long pre_positive_sum = 0.0;
    long long positivesum_dot_negativesum = 0;
    double auc = 0.0;
    double auc_res = 0.0;
    for (index_t i = 0; i < kMaxBucketSize; ++i) {
      pre_positive_sum = positive_sum;
      positive_sum += all_positive_number_[i];
      negative_sum += all_negative_number_[i];
      auc += (pre_positive_sum + positive_sum) * 
             (double)(all_negative_number_[i]) * 1.0 / 2;
    }
    positivesum_dot_negativesum = positive_sum * negative_sum;
    auc_res = auc / (positivesum_dot_negativesum);
    return 1.0 - auc_res;
  }